

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::ObjectivePropagation::getPropagationConstraint
          (ObjectivePropagation *this,HighsInt domchgStackSize,double **vals,HighsInt **inds,
          HighsInt *len,double *rhs,HighsInt domchgCol)

{
  int col;
  HighsObjectiveFunction *pHVar1;
  HighsInt *pHVar2;
  pointer piVar3;
  pointer piVar4;
  double *pdVar5;
  pointer pdVar6;
  long lVar7;
  uint uVar8;
  HighsInt j_1;
  long lVar9;
  HighsInt j;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  HighsInt pos;
  double local_c0;
  double local_b8;
  HighsInt local_ac;
  pointer local_a8;
  HighsDomain *local_a0;
  double local_98;
  ulong uStack_90;
  double **local_80;
  double *local_78;
  HighsObjectiveFunction *local_70;
  ulong local_68;
  ObjectivePropagation *local_60;
  ulong local_58;
  ulong local_50;
  double local_48;
  ulong uStack_40;
  
  pHVar1 = this->objFunc;
  pHVar2 = (pHVar1->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (pHVar1->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = (pHVar1->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *inds = pHVar2;
  local_70 = this->objFunc;
  *len = (HighsInt)
         ((ulong)((long)(local_70->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_70->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2);
  uVar8 = (int)((ulong)((long)piVar3 - (long)piVar4) >> 2) - 1;
  local_78 = rhs;
  if (uVar8 == 0) {
    *vals = (local_70->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    local_c0 = ((this->domain->mipsolver->mipdata_)._M_t.
                super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
                _M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
  }
  else {
    local_a0 = this->domain;
    local_a8 = (this->partitionCliqueData).
               super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_50 = 0;
    local_68 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      local_68 = local_50;
    }
    local_b8 = 0.0;
    local_c0 = ((local_a0->mipsolver->mipdata_)._M_t.
                super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
                _M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
    local_80 = vals;
    local_60 = this;
    while (local_50 != local_68) {
      piVar3 = (local_70->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)piVar3[local_50 + 1];
      pdVar5 = local_60->cost;
      dVar13 = 0.0;
      uStack_90 = 0;
      lVar9 = (long)piVar3[local_50];
      local_58 = local_50;
      local_50 = local_50 + 1;
      for (lVar10 = lVar9; lVar10 < lVar7; lVar10 = lVar10 + 1) {
        col = pHVar2[lVar10];
        if (col != domchgCol) {
          local_48 = pdVar5[col];
          uStack_40 = 0;
          local_98 = dVar13;
          if (local_48 <= 0.0) {
            dVar11 = getColUpperPos(local_a0,col,domchgStackSize,&local_ac);
            dVar13 = local_98;
            if (0.0 < dVar11) {
              uStack_90 = uStack_40 ^ 0x8000000000000000;
              dVar13 = -local_48;
              if (-local_48 <= local_98) {
                dVar13 = local_98;
              }
            }
          }
          else {
            dVar11 = getColLowerPos(local_a0,col,domchgStackSize,&local_ac);
            dVar13 = local_98;
            if ((dVar11 < 1.0) && (dVar13 = local_48, uStack_90 = uStack_40, local_48 <= local_98))
            {
              dVar13 = local_98;
            }
          }
        }
      }
      dVar12 = (double)local_a8[local_58].rhs * dVar13;
      dVar11 = local_c0 + dVar12;
      local_b8 = local_b8 + (local_c0 - (dVar11 - dVar12)) + (dVar12 - (dVar11 - (dVar11 - dVar12)))
      ;
      local_c0 = dVar11;
      if ((local_a8[local_58].multiplier != dVar13) ||
         (NAN(local_a8[local_58].multiplier) || NAN(dVar13))) {
        local_a8[local_58].multiplier = dVar13;
        pdVar6 = (local_60->propagationConsBuffer).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        for (; lVar9 < lVar7; lVar9 = lVar9 + 1) {
          dVar11 = (local_70->objectiveVals).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar9];
          pdVar6[lVar9] = dVar11 - (double)((ulong)ABS(dVar13) | (ulong)dVar11 & 0x8000000000000000)
          ;
        }
      }
    }
    *local_80 = (local_60->propagationConsBuffer).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
    local_c0 = local_c0 + local_b8;
  }
  *local_78 = local_c0;
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::getPropagationConstraint(
    HighsInt domchgStackSize, const double*& vals, const HighsInt*& inds,
    HighsInt& len, double& rhs, HighsInt domchgCol) {
  const HighsInt numPartitions = objFunc->getNumCliquePartitions();
  inds = objFunc->getObjectiveNonzeros().data();
  len = objFunc->getObjectiveNonzeros().size();
  if (numPartitions == 0) {
    vals = objFunc->getObjectiveValuesPacked().data();
    rhs = domain->mipsolver->mipdata_->upper_limit;
    return;
  }
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();

  HighsCDouble tmpRhs = domain->mipsolver->mipdata_->upper_limit;
  for (HighsInt i = 0; i < numPartitions; ++i) {
    HighsInt start = partitionStarts[i];
    HighsInt end = partitionStarts[i + 1];
    double largest = 0.0;
    for (HighsInt j = start; j < end; ++j) {
      HighsInt c = inds[j];
      HighsInt pos;
      // skip the column we might want to explain a bound change for and take
      // the second largest column instead.
      if (c == domchgCol) continue;
      if (cost[c] > 0) {
        double lb = domain->getColLowerPos(c, domchgStackSize, pos);
        if (lb < 1) largest = std::max(largest, cost[c]);
      } else {
        double ub = domain->getColUpperPos(c, domchgStackSize, pos);
        if (ub > 0) largest = std::max(largest, -cost[c]);
      }
    }

    tmpRhs += largest * partitionCliqueData[i].rhs;
    if (partitionCliqueData[i].multiplier != largest) {
      partitionCliqueData[i].multiplier = largest;
      const auto& packedObjVals = objFunc->getObjectiveValuesPacked();
      for (HighsInt j = start; j < end; ++j)
        propagationConsBuffer[j] =
            packedObjVals[j] - std::copysign(largest, packedObjVals[j]);
    }
  }

  vals = propagationConsBuffer.data();
  rhs = double(tmpRhs);
}